

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int RGB24Mirror(uint8_t *src_rgb24,int src_stride_rgb24,uint8_t *dst_rgb24,int dst_stride_rgb24,
               int width,int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  
  iVar1 = -1;
  if ((height != 0 && 0 < width) && (dst_rgb24 != (uint8_t *)0x0 && src_rgb24 != (uint8_t *)0x0)) {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_rgb24 = src_rgb24 + ~height * src_stride_rgb24;
      src_stride_rgb24 = -src_stride_rgb24;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0xfU) == 0) {
      pcVar3 = RGB24MirrorRow_SSSE3;
    }
    else {
      pcVar3 = RGB24MirrorRow_Any_SSSE3;
    }
    if ((uVar2 & 0x40) == 0) {
      pcVar3 = RGB24MirrorRow_C;
    }
    do {
      (*pcVar3)(src_rgb24,dst_rgb24,width);
      src_rgb24 = src_rgb24 + src_stride_rgb24;
      dst_rgb24 = dst_rgb24 + dst_stride_rgb24;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int RGB24Mirror(const uint8_t* src_rgb24,
                int src_stride_rgb24,
                uint8_t* dst_rgb24,
                int dst_stride_rgb24,
                int width,
                int height) {
  int y;
  void (*RGB24MirrorRow)(const uint8_t* src, uint8_t* dst, int width) =
      RGB24MirrorRow_C;
  if (!src_rgb24 || !dst_rgb24 || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_rgb24 = src_rgb24 + (height - 1) * src_stride_rgb24;
    src_stride_rgb24 = -src_stride_rgb24;
  }
#if defined(HAS_RGB24MIRRORROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    RGB24MirrorRow = RGB24MirrorRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      RGB24MirrorRow = RGB24MirrorRow_NEON;
    }
  }
#endif
#if defined(HAS_RGB24MIRRORROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    RGB24MirrorRow = RGB24MirrorRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      RGB24MirrorRow = RGB24MirrorRow_SSSE3;
    }
  }
#endif

  // Mirror plane
  for (y = 0; y < height; ++y) {
    RGB24MirrorRow(src_rgb24, dst_rgb24, width);
    src_rgb24 += src_stride_rgb24;
    dst_rgb24 += dst_stride_rgb24;
  }
  return 0;
}